

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O2

void http1_after_finish(http_s *h)

{
  uintptr_t uVar1;
  
  uVar1 = (h->private_data).flag;
  *(byte *)(uVar1 + 0x102) = *(byte *)(uVar1 + 0x102) & 0xfe;
  if ((http_s *)(uVar1 + 0x68) == h) {
    http_s_destroy(h,*(uint8_t *)(*(long *)(uVar1 + 0x38) + 0x7a));
    http_s_new(h,(http_fio_protocol_s *)(h->private_data).flag,
               (http_vtable_s *)(h->private_data).vtbl);
  }
  else {
    http_s_destroy(h,'\0');
    fio_free(h);
  }
  if (*(char *)(uVar1 + 0x100) != '\0') {
    fio_close(*(intptr_t *)(uVar1 + 0x30));
    return;
  }
  return;
}

Assistant:

static inline void http1_after_finish(http_s *h) {
  http1pr_s *p = handle2pr(h);
  p->stop = p->stop & (~1UL);
  if (h != &p->request) {
    http_s_destroy(h, 0);
    fio_free(h);
  } else {
    http_s_clear(h, p->p.settings->log);
  }
  if (p->close)
    fio_close(p->p.uuid);
}